

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cavalry.hpp
# Opt level: O2

void __thiscall Cavalry::~Cavalry(Cavalry *this)

{
  (this->super_Follower).super_GreenCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_001166a8;
  std::__cxx11::string::~string((string *)&this->cardText);
  std::__cxx11::string::~string((string *)&this->name);
  Follower::~Follower(&this->super_Follower);
  return;
}

Assistant:

~Cavalry() {}